

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<float,tcu::Vector<float,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_tcu::Vector<float,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  ostringstream *poVar1;
  float fVar2;
  pointer pVVar3;
  pointer pVVar4;
  Variable<tcu::Vector<float,_2>_> *pVVar5;
  pointer pcVar6;
  Variable<float> *pVVar7;
  double dVar8;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_tcu::Vector<float,_2>_>_>
  *pVVar9;
  undefined8 uVar10;
  bool bVar11;
  bool bVar12;
  ContextType type;
  int iVar13;
  _Rb_tree_node_base *p_Var14;
  char *pcVar15;
  size_t sVar16;
  long *plVar17;
  ShaderExecutor *pSVar18;
  long lVar19;
  IVal *pIVar20;
  IVal *x;
  TestError *this_00;
  uint uVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  Vector<float,_2> *val;
  size_t size;
  ulong uVar23;
  IVal IVar24;
  PrecisionCase *pPVar25;
  double dVar26;
  IVal in1;
  FuncSet funcs;
  IVal in2;
  IVal in3;
  ostringstream os;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_tcu::Vector<float,_2>_>_> outputs;
  ShaderSpec spec;
  ostringstream oss;
  PrecisionCase *local_508;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_tcu::Vector<float,_2>_>_>
  *local_500;
  string local_4f8;
  undefined1 local_4d8 [8];
  undefined8 local_4d0;
  undefined1 local_4c8 [24];
  double local_4b0;
  pointer local_4a8;
  Statement *local_4a0;
  string local_498;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_478;
  FloatFormat *local_470;
  IVal local_468;
  long local_448;
  ResultCollector *local_440;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  double local_418;
  Data DStack_410;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  FloatFormat local_2b8;
  size_t local_290;
  ulong local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_280;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_tcu::Vector<float,_2>_>_> local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [32];
  double local_188;
  double dStack_180;
  ios_base local_138 [264];
  
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  size = (long)pVVar4 - (long)pVVar3 >> 3;
  local_500 = variables;
  local_4a0 = stmt;
  local_478 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_tcu::Vector<float,_2>_>_>::Outputs
            (&local_250,size);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_2b8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_280._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_280._M_impl.super__Rb_tree_header._M_header;
  local_280._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_280._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_280._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_438 + 8);
  local_280._M_impl.super__Rb_tree_header._M_header._M_right =
       local_280._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Statement: ",0xb);
  (*local_4a0->_vptr_Statement[2])(local_4a0,poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_508 = this;
  local_4a8 = pVVar3;
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_4d0 = (double)((ulong)local_4d0._4_4_ << 0x20);
  local_4c8._0_4_ = 0.0;
  local_4c8._4_4_ = 0.0;
  local_4b0 = 0.0;
  local_4c8._8_8_ = (_Rb_tree_node_base *)&local_4d0;
  local_4c8._16_8_ = (_Rb_tree_node_base *)&local_4d0;
  (*local_4a0->_vptr_Statement[4])(local_4a0,local_4d8);
  if ((_Rb_tree_node_base *)local_4c8._8_8_ != (_Rb_tree_node_base *)&local_4d0) {
    p_Var14 = (_Rb_tree_node_base *)local_4c8._8_8_;
    do {
      (**(code **)(**(long **)(p_Var14 + 1) + 0x30))(*(long **)(p_Var14 + 1),local_1a8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != (_Rb_tree_node_base *)&local_4d0);
  }
  pPVar25 = local_508;
  if (local_4b0 != 0.0) {
    local_438._0_8_ = ((local_508->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_438 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"precision ",10);
  pcVar15 = glu::getPrecisionName((pPVar25->m_ctx).precision);
  if (pcVar15 == (char *)0x0) {
    std::ios::clear((int)((long)&local_508 + *(long *)(local_438._0_8_ + -0x18)) + 0xd0);
  }
  else {
    sVar16 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,pcVar15,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar6 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_508->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_508->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_508->m_extension);
    plVar17 = (long *)std::__cxx11::string::append(local_1a8);
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 == paVar22) {
      local_428._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_428._8_8_ = plVar17[3];
      local_438._0_8_ = &local_428;
    }
    else {
      local_428._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_438._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar17;
    }
    local_438._8_8_ = plVar17[1];
    *plVar17 = (long)paVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != &local_428) {
      operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar6) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_438,local_508,
             (local_500->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar10 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._0_8_ != &local_428) {
    operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_438,local_508,
             (local_500->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar10 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_438);
  glu::VarType::operator=(&((pointer)(uVar10 + 0x38))->varType,(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._0_8_ != &local_428) {
    operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
  }
  makeSymbol<float>((Symbol *)local_438,local_508,
                    (local_500->out0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar10 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._0_8_ != &local_428) {
    operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  (*local_4a0->_vptr_Statement[2])(local_4a0,local_438);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  pPVar25 = local_508;
  pSVar18 = ShaderExecUtil::createExecutor
                      ((local_508->m_ctx).renderContext,(local_508->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  local_438._0_8_ =
       (local_478->in0).
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_438._8_8_ =
       (local_478->in1).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_428._M_allocated_capacity =
       (size_type)
       (local_478->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_428._8_8_ =
       (local_478->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_250.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_250.out1.
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar18->_vptr_ShaderExecutor[3])
            (pSVar18,((pPVar25->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar13 = (*pSVar18->_vptr_ShaderExecutor[2])(pSVar18);
  if ((char)iVar13 != '\0') {
    (*pSVar18->_vptr_ShaderExecutor[5])(pSVar18);
    (*pSVar18->_vptr_ShaderExecutor[6])(pSVar18,size & 0xffffffff,local_438,local_1a8);
    local_470 = &(pPVar25->m_ctx).floatFormat;
    (*pSVar18->_vptr_ShaderExecutor[1])(pSVar18);
    pVVar9 = local_500;
    lVar19 = 0x10;
    do {
      *(undefined1 *)((long)&local_448 + lVar19) = 0;
      *(undefined8 *)((long)&local_440 + lVar19) = 0x7ff0000000000000;
      *(undefined8 *)(local_438 + lVar19) = 0xfff0000000000000;
      lVar19 = lVar19 + 0x18;
    } while (lVar19 != 0x40);
    lVar19 = 0x10;
    do {
      *(undefined1 *)((long)&local_448 + lVar19) = 0;
      *(undefined8 *)((long)&local_440 + lVar19) = 0x7ff0000000000000;
      *(undefined8 *)(local_438 + lVar19) = 0xfff0000000000000;
      lVar19 = lVar19 + 0x18;
    } while (lVar19 == 0x28);
    local_4d8 = (undefined1  [8])((ulong)local_4d8 & 0xffffffffffffff00);
    local_4d0 = INFINITY;
    local_4c8._0_4_ = 0.0;
    local_4c8._4_4_ = -NAN;
    lVar19 = 0x10;
    do {
      local_1b8._M_local_buf[lVar19] = '\0';
      *(undefined8 *)(local_1a8 + lVar19 + -8) = 0x7ff0000000000000;
      *(undefined8 *)(local_1a8 + lVar19) = 0xfff0000000000000;
      lVar19 = lVar19 + 0x18;
    } while (lVar19 != 0x40);
    lVar19 = 0x10;
    do {
      local_1b8._M_local_buf[lVar19] = '\0';
      *(undefined8 *)(local_1a8 + lVar19 + -8) = 0x7ff0000000000000;
      *(undefined8 *)(local_1a8 + lVar19) = 0xfff0000000000000;
      lVar19 = lVar19 + 0x18;
    } while (lVar19 == 0x28);
    Environment::bind<tcu::Vector<float,2>>
              ((Environment *)&local_280,
               (local_500->in0).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
               .m_ptr,(IVal *)local_438);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_280,
               (pVVar9->in1).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_4f8);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_280,
               (pVVar9->in2).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_498);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_280,
               (pVVar9->in3).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_468);
    Environment::bind<float>
              ((Environment *)&local_280,
               (pVVar9->out0).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
               (IVal *)local_4d8);
    Environment::bind<tcu::Vector<float,2>>
              ((Environment *)&local_280,
               (pVVar9->out1).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
               .m_ptr,(IVal *)local_1a8);
    local_290 = size;
    if (pVVar4 == local_4a8) {
      local_4a8 = (pointer)0x0;
    }
    else {
      local_440 = &pPVar25->m_status;
      local_288 = size + (size == 0);
      uVar23 = 0;
      local_4a8 = (pointer)0x0;
      do {
        local_468._0_8_ = local_468._0_8_ & 0xffffffffffffff00;
        local_468.m_lo = INFINITY;
        local_468.m_hi = -INFINITY;
        lVar19 = 0x10;
        do {
          local_1b8._M_local_buf[lVar19] = '\0';
          *(undefined8 *)(local_1a8 + lVar19 + -8) = 0x7ff0000000000000;
          *(undefined8 *)(local_1a8 + lVar19) = 0xfff0000000000000;
          lVar19 = lVar19 + 0x18;
        } while (lVar19 != 0x40);
        lVar19 = 0x10;
        do {
          local_1b8._M_local_buf[lVar19] = '\0';
          *(undefined8 *)(local_1a8 + lVar19 + -8) = 0x7ff0000000000000;
          *(undefined8 *)(local_1a8 + lVar19) = 0xfff0000000000000;
          lVar19 = lVar19 + 0x18;
        } while (lVar19 == 0x28);
        if ((uVar23 & 0xfff) == 0) {
          tcu::TestContext::touchWatchdog((pPVar25->super_TestCase).super_TestNode.m_testCtx);
        }
        local_4f8._M_dataplus._M_p =
             *(pointer *)
              (local_478->in0).
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar23].m_data;
        ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                  ((IVal *)local_4d8,local_470,(Vector<float,_2> *)&local_4f8);
        pVVar9 = local_500;
        ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                  ((IVal *)local_438,local_470,(IVal *)local_4d8);
        pIVar20 = Environment::lookup<tcu::Vector<float,2>>
                            ((Environment *)&local_280,
                             (pVVar9->in0).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                             .m_ptr);
        pIVar20->m_data[1].m_lo = local_418;
        pIVar20->m_data[1].m_hi = (double)CONCAT44(DStack_410.basic.precision,DStack_410.basic.type)
        ;
        pIVar20->m_data[0].m_hi = (double)local_428._M_allocated_capacity;
        *(undefined8 *)(pIVar20->m_data + 1) = local_428._8_8_;
        *(undefined8 *)pIVar20->m_data = local_438._0_8_;
        pIVar20->m_data[0].m_lo = (double)local_438._8_8_;
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_280,
                   (pVVar9->in1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_280,
                   (pVVar9->in2).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_280,
                   (pVVar9->in3).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        DStack_410.basic.type = (pPVar25->m_ctx).precision;
        local_418 = local_470->m_maxValue;
        local_438._0_8_ = *(undefined8 *)local_470;
        local_438._8_8_ = *(undefined8 *)&local_470->m_fractionBits;
        local_428._M_allocated_capacity = *(undefined8 *)&local_470->m_hasInf;
        local_428._8_8_ = *(undefined8 *)&local_470->m_exactPrecision;
        local_400 = 0;
        DStack_410._8_8_ = &local_280;
        (*local_4a0->_vptr_Statement[3])(local_4a0,(IVal *)local_438);
        pIVar20 = Environment::lookup<tcu::Vector<float,2>>
                            ((Environment *)&local_280,
                             (pVVar9->out1).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                             .m_ptr);
        ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                  ((IVal *)local_438,&local_2b8,pIVar20);
        dStack_180 = (double)CONCAT44(DStack_410.basic.precision,DStack_410.basic.type);
        local_188 = local_418;
        local_1a8._16_8_ = local_428._M_allocated_capacity;
        local_1a8._24_8_ = local_428._8_8_;
        local_1a8._0_8_ = local_438._0_8_;
        local_1a8._8_8_ = local_438._8_8_;
        local_448 = uVar23 * 8;
        bVar11 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                           ((IVal *)local_1a8,
                            (Vector<float,_2> *)
                            ((long)local_250.out1.
                                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar23 * 8));
        local_438._0_8_ = &local_428;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,"Shader output 1 is outside acceptable range","");
        bVar11 = tcu::ResultCollector::check(local_440,bVar11,(string *)local_438);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._0_8_ != &local_428) {
          operator_delete((void *)local_438._0_8_,(ulong)(local_428._M_allocated_capacity + 1));
        }
        x = Environment::lookup<float>
                      ((Environment *)&local_280,
                       (local_500->out0).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.
                       m_ptr);
        tcu::FloatFormat::convert((Interval *)local_438,&local_2b8,x);
        local_468.m_hi = (double)local_428._M_allocated_capacity;
        local_468._0_8_ = local_438._0_8_;
        uVar10 = local_468._0_8_;
        local_468.m_lo = (double)local_438._8_8_;
        fVar2 = *(float *)((long)(qpTestLog **)
                                 local_250.out0.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar23 * 4);
        dVar26 = (double)fVar2;
        dVar8 = dVar26;
        if (NAN(fVar2)) {
          dVar8 = INFINITY;
          dVar26 = -INFINITY;
        }
        IVar24 = (IVal)(dVar26 <= (double)local_428._M_allocated_capacity &&
                       (double)local_438._8_8_ <= dVar8);
        if ((NAN(fVar2)) &&
           (dVar26 <= (double)local_428._M_allocated_capacity && (double)local_438._8_8_ <= dVar8))
        {
          local_468.m_hasNaN = SUB81(local_438._0_8_,0);
          IVar24 = (IVal)local_468.m_hasNaN;
        }
        local_438._0_8_ = &local_428;
        local_468._0_8_ = uVar10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,"Shader output 0 is outside acceptable range","");
        bVar12 = tcu::ResultCollector::check(local_440,(bool)((byte)IVar24 & 1),(string *)local_438)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._0_8_ != &local_428) {
          operator_delete((void *)local_438._0_8_,(ulong)(local_428._M_allocated_capacity + 1));
        }
        pPVar25 = local_508;
        uVar21 = (int)local_4a8 + ((byte)~(bVar11 && bVar12) & 1);
        local_4a8 = (pointer)(ulong)uVar21;
        if ((int)uVar21 < 0x65 && (!bVar11 || !bVar12)) {
          local_438._0_8_ = ((local_508->super_TestCase).super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_438 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          pcVar15 = "Failed";
          if (bVar11 && bVar12) {
            pcVar15 = "Passed";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar15,6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
          pVVar5 = (local_500->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                   .m_ptr;
          val = (Vector<float,_2> *)local_4c8;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_4d8 = (undefined1  [8])val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4d8,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,(char *)local_4d8,(long)local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
          valueToString<tcu::Vector<float,2>>
                    (&local_4f8,(BuiltinPrecisionTests *)&local_2b8,
                     (FloatFormat *)
                     ((long)((local_478->in0).
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + local_448),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
          }
          if (local_4d8 != (undefined1  [8])local_4c8) {
            operator_delete((void *)local_4d8,(ulong)(local_4c8._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
          pVVar7 = (local_500->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          local_4d8 = (undefined1  [8])local_4c8;
          pcVar6 = (pVVar7->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4d8,pcVar6,pcVar6 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,(char *)local_4d8,(long)local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
          valueToString<float>
                    (&local_4f8,&local_2b8,
                     (float *)((long)(qpTestLog **)
                                     local_250.out0.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + uVar23 * 4));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"\tExpected range: ",0x11);
          intervalToString<float>(&local_498,&local_2b8,&local_468);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_498._M_dataplus._M_p,local_498._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
          }
          if (local_4d8 != (undefined1  [8])local_4c8) {
            operator_delete((void *)local_4d8,(ulong)(local_4c8._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
          pVVar5 = (local_500->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                   .m_ptr;
          pIVar20 = (IVal *)local_4c8;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_4d8 = (undefined1  [8])pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4d8,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,(char *)local_4d8,(long)local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
          valueToString<tcu::Vector<float,2>>
                    (&local_4f8,(BuiltinPrecisionTests *)&local_2b8,
                     (FloatFormat *)
                     ((long)local_250.out1.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_448),
                     (Vector<float,_2> *)pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,2>>
                    (&local_498,(BuiltinPrecisionTests *)&local_2b8,(FloatFormat *)local_1a8,pIVar20
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_498._M_dataplus._M_p,local_498._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
          }
          if (local_4d8 != (undefined1  [8])local_4c8) {
            operator_delete((void *)local_4d8,(ulong)(local_4c8._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_3c0);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != local_288);
    }
    iVar13 = (int)local_4a8;
    if (100 < iVar13) {
      local_438._0_8_ = ((pPVar25->super_TestCase).super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_438 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(Skipped ",9);
      std::ostream::operator<<(poVar1,iVar13 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_3c0);
    }
    if (iVar13 == 0) {
      local_438._0_8_ = ((pPVar25->super_TestCase).super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_438 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"All ",4);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," inputs passed.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_438._0_8_ = ((pPVar25->super_TestCase).super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_438 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::ostream::operator<<(poVar1,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," inputs failed.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_438 + 8));
    std::ios_base::~ios_base(local_3c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
    ::~_Rb_tree(&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_p != &local_1b8) {
      operator_delete(local_1c8._M_p,
                      CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_p != &local_1d8) {
      operator_delete(local_1e8._M_p,
                      CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1)
      ;
    }
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    ~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    ~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
    if ((pointer)local_250.out1.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.out1.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_250.out1.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.out1.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((TestLog *)
        local_250.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (TestLog *)0x0) {
      operator_delete(local_250.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_250.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
             ,0x11d4);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}